

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerHLSL::emit_interface_block_in_struct
          (CompilerHLSL *this,SPIRVariable *var,
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *active_locations)

{
  bool bVar1;
  uint32_t uVar2;
  SPIRType *pSVar3;
  CompilerError *pCVar4;
  mapped_type *pmVar5;
  Bitset *pBVar6;
  bool bVar7;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> pVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f8 [32];
  _Node_iterator_base<unsigned_int,_false> local_4d8;
  undefined1 local_4d0;
  value_type local_4c4;
  uint local_4c0;
  uint local_4bc;
  uint32_t i_1;
  uint32_t consumed_locations;
  uint32_t local_494;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_490 [32];
  _Node_iterator_base<unsigned_int,_false> local_470;
  undefined1 local_468;
  ExecutionModel local_45c;
  spirv_cross local_458 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438 [36];
  uint32_t local_414;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410 [32];
  undefined1 local_3f0 [8];
  SPIRType newtype;
  uint32_t i;
  undefined1 local_278 [8];
  string semantic;
  ExecutionModel local_254;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250 [4];
  uint32_t location_number;
  string name;
  Decoration *m;
  anon_class_8_1_33ba97e3 aStack_220;
  bool need_matrix_unroll;
  anon_class_8_1_33ba97e3 get_vacant_location;
  char *local_210;
  spirv_cross local_208 [38];
  char local_1e2;
  allocator local_1e1;
  string local_1e0 [36];
  uint32_t local_1bc;
  uint32_t local_1b8;
  uint32_t location;
  uint32_t local_1a4;
  uint32_t local_1a0;
  byte local_19a;
  byte local_199;
  uint32_t index;
  bool legacy;
  bool use_location_number;
  string binding;
  undefined1 local_178 [8];
  SPIRType type;
  SPIREntryPoint *execution;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *active_locations_local;
  SPIRVariable *var_local;
  CompilerHLSL *this_local;
  
  type.member_name_cache._M_h._M_single_bucket =
       (__node_base_ptr)Compiler::get_entry_point((Compiler *)this);
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).field_0xc);
  pSVar3 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar2);
  SPIRType::SPIRType((SPIRType *)local_178,pSVar3);
  ::std::__cxx11::string::string((string *)&index);
  local_199 = 1;
  local_19a = *(uint *)&(this->super_CompilerGLSL).field_0x241c < 0x1f;
  if ((*(int *)&type.member_name_cache._M_h._M_single_bucket[0x1b]._M_nxt == 4) &&
     (var->storage == StorageClassOutput)) {
    local_1a4 = (var->super_IVariant).self.id;
    local_1a0 = Compiler::get_decoration((Compiler *)this,(ID)local_1a4,DecorationIndex);
    local_1bc = (var->super_IVariant).self.id;
    local_1b8 = Compiler::get_decoration((Compiler *)this,(ID)local_1bc,DecorationLocation);
    if ((local_1a0 != 0) && (local_1b8 != 0)) {
      local_1e2 = '\x01';
      pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_1e0,"Dual-source blending is only supported on MRT #0 in HLSL.",&local_1e1);
      CompilerError::CompilerError(pCVar4,(string *)local_1e0);
      local_1e2 = '\0';
      __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    local_210 = "SV_Target";
    if ((local_19a & 1) != 0) {
      local_210 = "COLOR";
    }
    get_vacant_location.active_locations._4_4_ = local_1b8 + local_1a0;
    join<char_const*,unsigned_int>
              (local_208,&local_210,(uint *)((long)&get_vacant_location.active_locations + 4));
    ::std::__cxx11::string::operator=((string *)&index,(string *)local_208);
    ::std::__cxx11::string::~string((string *)local_208);
    local_199 = 0;
    if ((local_19a & 1) != 0) {
      type.super_IVariant._12_4_ = 4;
    }
  }
  bVar7 = false;
  if (var->storage == StorageClassInput) {
    bVar7 = *(int *)&type.member_name_cache._M_h._M_single_bucket[0x1b]._M_nxt == 0;
  }
  aStack_220.active_locations = active_locations;
  pmVar5 = ::std::
           unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
           ::operator[](&(this->super_CompilerGLSL).super_Compiler.ir.meta,
                        &(var->super_IVariant).self);
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).self);
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])(local_250,this,(ulong)uVar2,1);
  if ((local_199 & 1) == 0) {
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x1a])
              (local_4f8,this,local_178,local_250,0);
    CompilerGLSL::
    statement<std::__cxx11::string,char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
              (&this->super_CompilerGLSL,local_4f8,(char (*) [4])0x4e5f4b,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&index,
               (char (*) [2])0x4d9ce2);
    ::std::__cxx11::string::~string((string *)local_4f8);
  }
  else {
    bVar1 = Bitset::get(&(pmVar5->decoration).decoration_flags,0x1e);
    if (bVar1) {
      local_254 = (pmVar5->decoration).location;
    }
    else {
      local_254 = emit_interface_block_in_struct::anon_class_8_1_33ba97e3::operator()
                            (&stack0xfffffffffffffde0);
    }
    to_semantic_abi_cxx11_
              ((CompilerHLSL *)local_278,(uint32_t)this,local_254,
               *(StorageClass *)&type.member_name_cache._M_h._M_single_bucket[0x1b]._M_nxt);
    if ((bVar7) && (1 < type.width)) {
      bVar7 = VectorView<unsigned_int>::empty((VectorView<unsigned_int> *)&type.columns);
      if (!bVar7) {
        newtype.member_name_cache._M_h._M_single_bucket._6_1_ = 1;
        pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&i,"Arrays of matrices used as input/output. This is not supported.",
                   (allocator *)((long)&newtype.member_name_cache._M_h._M_single_bucket + 7));
        CompilerError::CompilerError(pCVar4,(string *)&i);
        newtype.member_name_cache._M_h._M_single_bucket._6_1_ = 0;
        __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      for (newtype.member_name_cache._M_h._M_single_bucket._0_4_ = 0;
          (uint)newtype.member_name_cache._M_h._M_single_bucket < type.width;
          newtype.member_name_cache._M_h._M_single_bucket._0_4_ =
               (uint)newtype.member_name_cache._M_h._M_single_bucket + 1) {
        SPIRType::SPIRType((SPIRType *)local_3f0,(SPIRType *)local_178);
        newtype.width = 1;
        local_414 = (var->super_IVariant).self.id;
        pBVar6 = Compiler::get_decoration_bitset((Compiler *)this,(ID)local_414);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x2e])(local_410,this,pBVar6);
        join<std::__cxx11::string&,char_const(&)[2],unsigned_int&>
                  (local_458,local_250,(char (*) [2])0x4e3b4c,
                   (uint *)&newtype.member_name_cache._M_h._M_single_bucket);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x1a])
                  (local_438,this,local_3f0,local_458,0);
        CompilerGLSL::
        statement<std::__cxx11::string,std::__cxx11::string,char_const(&)[4],std::__cxx11::string&,char_const(&)[2],unsigned_int&,char_const(&)[2]>
                  (&this->super_CompilerGLSL,local_410,local_438,(char (*) [4])0x4e5f4b,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278,
                   (char (*) [2])0x4e3b4c,(uint *)&newtype.member_name_cache._M_h._M_single_bucket,
                   (char (*) [2])0x4d9ce2);
        ::std::__cxx11::string::~string((string *)local_438);
        ::std::__cxx11::string::~string((string *)local_458);
        ::std::__cxx11::string::~string((string *)local_410);
        local_45c = local_254;
        pVar8 = ::std::
                unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                ::insert(active_locations,&local_45c);
        local_470._M_cur =
             (__node_type *)pVar8.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
        local_468 = pVar8.second;
        SPIRType::~SPIRType((SPIRType *)local_3f0);
        local_254 = local_254 + ExecutionModelTessellationControl;
      }
    }
    else {
      local_494 = (var->super_IVariant).self.id;
      pBVar6 = Compiler::get_decoration_bitset((Compiler *)this,(ID)local_494);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x2e])(local_490,this,pBVar6);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x1a])
                (&i_1,this,local_178,local_250,0);
      CompilerGLSL::
      statement<std::__cxx11::string,std::__cxx11::string,char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
                (&this->super_CompilerGLSL,local_490,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i_1,
                 (char (*) [4])0x4e5f4b,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278,
                 (char (*) [2])0x4d9ce2);
      ::std::__cxx11::string::~string((string *)&i_1);
      ::std::__cxx11::string::~string((string *)local_490);
      local_4bc = type_to_consumed_locations(this,(SPIRType *)local_178);
      for (local_4c0 = 0; local_4c0 < local_4bc; local_4c0 = local_4c0 + 1) {
        local_4c4 = local_254 + local_4c0;
        pVar8 = ::std::
                unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                ::insert(active_locations,&local_4c4);
        local_4d8._M_cur =
             (__node_type *)pVar8.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
        local_4d0 = pVar8.second;
      }
    }
    ::std::__cxx11::string::~string((string *)local_278);
  }
  ::std::__cxx11::string::~string((string *)local_250);
  ::std::__cxx11::string::~string((string *)&index);
  SPIRType::~SPIRType((SPIRType *)local_178);
  return;
}

Assistant:

void CompilerHLSL::emit_interface_block_in_struct(const SPIRVariable &var, unordered_set<uint32_t> &active_locations)
{
	auto &execution = get_entry_point();
	auto type = get<SPIRType>(var.basetype);

	string binding;
	bool use_location_number = true;
	bool legacy = hlsl_options.shader_model <= 30;
	if (execution.model == ExecutionModelFragment && var.storage == StorageClassOutput)
	{
		// Dual-source blending is achieved in HLSL by emitting to SV_Target0 and 1.
		uint32_t index = get_decoration(var.self, DecorationIndex);
		uint32_t location = get_decoration(var.self, DecorationLocation);

		if (index != 0 && location != 0)
			SPIRV_CROSS_THROW("Dual-source blending is only supported on MRT #0 in HLSL.");

		binding = join(legacy ? "COLOR" : "SV_Target", location + index);
		use_location_number = false;
		if (legacy) // COLOR must be a four-component vector on legacy shader model targets (HLSL ERR_COLOR_4COMP)
			type.vecsize = 4;
	}

	const auto get_vacant_location = [&]() -> uint32_t {
		for (uint32_t i = 0; i < 64; i++)
			if (!active_locations.count(i))
				return i;
		SPIRV_CROSS_THROW("All locations from 0 to 63 are exhausted.");
	};

	bool need_matrix_unroll = var.storage == StorageClassInput && execution.model == ExecutionModelVertex;

	auto &m = ir.meta[var.self].decoration;
	auto name = to_name(var.self);
	if (use_location_number)
	{
		uint32_t location_number;

		// If an explicit location exists, use it with TEXCOORD[N] semantic.
		// Otherwise, pick a vacant location.
		if (m.decoration_flags.get(DecorationLocation))
			location_number = m.location;
		else
			location_number = get_vacant_location();

		// Allow semantic remap if specified.
		auto semantic = to_semantic(location_number, execution.model, var.storage);

		if (need_matrix_unroll && type.columns > 1)
		{
			if (!type.array.empty())
				SPIRV_CROSS_THROW("Arrays of matrices used as input/output. This is not supported.");

			// Unroll matrices.
			for (uint32_t i = 0; i < type.columns; i++)
			{
				SPIRType newtype = type;
				newtype.columns = 1;
				statement(to_interpolation_qualifiers(get_decoration_bitset(var.self)),
				          variable_decl(newtype, join(name, "_", i)), " : ", semantic, "_", i, ";");
				active_locations.insert(location_number++);
			}
		}
		else
		{
			statement(to_interpolation_qualifiers(get_decoration_bitset(var.self)), variable_decl(type, name), " : ",
			          semantic, ";");

			// Structs and arrays should consume more locations.
			uint32_t consumed_locations = type_to_consumed_locations(type);
			for (uint32_t i = 0; i < consumed_locations; i++)
				active_locations.insert(location_number + i);
		}
	}
	else
		statement(variable_decl(type, name), " : ", binding, ";");
}